

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_lnx_ModuleEnumerator.cpp
# Opt level: O2

bool axl::sys::lnx::parseProcModulesFile<axl::sys::lnx::EnumeratorModulesParser>
               (EnumeratorModulesParser *parser)

{
  bool bVar1;
  int iVar2;
  ModuleState state;
  size_t sVar3;
  C *pCVar4;
  ulong size;
  void *pvVar5;
  ulong offset;
  undefined1 uVar6;
  char *pcVar7;
  C *pCVar8;
  File file;
  char *local_b8;
  undefined4 local_ac;
  C *local_a8;
  char *local_a0;
  EnumeratorModulesParser *local_98;
  ulong local_90;
  Array<char,_axl::sl::ArrayDetails<char>_> buffer;
  StringRef name;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_50;
  
  file.m_file.super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.m_h =
       (FileImpl)(Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>)0xffffffff;
  sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase(&name,"/proc/modules");
  iVar2 = io::File::open(&file,(char *)&name,1);
  sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase(&name);
  if ((char)iVar2 == '\0') {
    uVar6 = 0;
  }
  else {
    buffer.super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>.m_p = (char *)0x0;
    buffer.super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>.m_hdr = (Hdr *)0x0;
    buffer.super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>.m_count = 0;
    local_98 = parser;
    sVar3 = io::readFile(&buffer,&file);
    local_ac = (undefined4)CONCAT71((int7)(sVar3 >> 8),sVar3 != 0xffffffffffffffff);
    if (sVar3 != 0xffffffffffffffff) {
      pCVar8 = buffer.super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>.m_p +
               buffer.super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>.m_count;
      pcVar7 = buffer.super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>.m_p;
      local_a8 = pCVar8;
      while (pcVar7 < pCVar8) {
        pCVar4 = (C *)memchr(pcVar7,10,(long)pCVar8 - (long)pcVar7);
        if (pCVar4 == (C *)0x0) {
          pCVar4 = pCVar8;
        }
        local_b8 = (char *)memchr(pcVar7,0x20,(long)pCVar4 - (long)pcVar7);
        if (local_b8 != (char *)0x0) {
          sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase
                    (&name,pcVar7,(long)local_b8 - (long)pcVar7,false);
          pcVar7 = local_b8 + 1;
          size = strtoul(pcVar7,&local_b8,0);
          if ((((local_b8 != pcVar7) && (*local_b8 == ' ')) &&
              (pcVar7 = local_b8 + 1, local_90 = strtoul(pcVar7,&local_b8,0), local_b8 != pcVar7))
             && ((*local_b8 == ' ' &&
                 (pvVar5 = memchr(local_b8 + 1,0x20,(long)pCVar4 - (long)(local_b8 + 1)),
                 pvVar5 != (void *)0x0)))) {
            pCVar8 = (C *)((long)pvVar5 + 1);
            local_b8 = (char *)memchr(pCVar8,0x20,(long)pCVar4 - (long)pCVar8);
            if (local_b8 != (char *)0x0) {
              local_a0 = local_b8;
              sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase
                        (&local_50,pCVar8,(long)local_b8 - (long)pCVar8,false);
              state = parseModuleState(&local_50);
              sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase(&local_50);
              if ((state != ModuleState_Unknown) &&
                 (pcVar7 = local_a0 + 1, offset = strtoul(pcVar7,&local_b8,0), local_b8 != pcVar7))
              {
                bVar1 = EnumeratorModulesParser::processModule
                                  (local_98,&name,size,local_90,state,offset);
                sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase(&name);
                pCVar8 = local_a8;
                if (bVar1) goto LAB_00145ab6;
                break;
              }
            }
          }
          sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase(&name);
          pCVar8 = local_a8;
        }
LAB_00145ab6:
        pcVar7 = pCVar4 + 1;
      }
    }
    sl::ArrayRef<char,_axl::sl::ArrayDetails<char>_>::~ArrayRef
              (&buffer.super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>);
    uVar6 = (undefined1)local_ac;
  }
  sl::Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>::~Handle
            ((Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_> *)&file);
  return (bool)uVar6;
}

Assistant:

bool
parseProcModulesFile(Parser& parser) {
	io::File file;
	bool result = file.open("/proc/modules", io::FileFlag_ReadOnly);
	if (!result)
		return false;

	sl::Array<char> buffer;
	size_t size = io::readFile(&buffer, &file);
	if (size == -1)
		return false;

	const char* p = buffer.cp();
	const char* end = buffer.getEnd();
	const char* eol;

	for (; p < end; p = eol + 1) {
		eol = (char*)memchr(p, '\n', end - p);
		if (!eol)
			eol = end;

		char* next = (char*)memchr(p, ' ', eol - p);
		if (!next)
			continue;

		sl::StringRef name(p, next - p);
		if (!parser.checkModuleName(name))
			continue;

		p = next + 1;

		size_t size = strtoul(p, &next, 0);
		if (next == p || *next != ' ')
			continue;

		p = next + 1;
		size_t useCount = strtoul(p, &next, 0);
		if (next == p || *next != ' ')
			continue;

		p = next + 1;
		next = (char*)memchr(p, ' ', eol - p);
		if (!next)
			continue;

		p = next + 1;
		next = (char*)memchr(p, ' ', eol - p);
		if (!next)
			continue;

		ModuleState state = parseModuleState(sl::StringRef(p, next - p));
		if (!state)
			continue;

		p = next + 1;
		size_t offset = strtoul(p, &next, 0);
		if (next == p)
			continue;

		result = parser.processModule(name, size, useCount, state, offset);
		if (!result)
			break;
	}

	return true;
}